

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rect.c
# Opt level: O0

int get_rect_ind(nhrect *r)

{
  int local_34;
  int i;
  int hy;
  int hx;
  int ly;
  int lx;
  nhrect *rectp;
  nhrect *r_local;
  
  local_34 = 0;
  _ly = rect;
  while( true ) {
    if (rect_cnt <= local_34) {
      return -1;
    }
    if ((((r->lx == _ly->lx) && (r->ly == _ly->ly)) && (r->hx == _ly->hx)) && (r->hy == _ly->hy))
    break;
    local_34 = local_34 + 1;
    _ly = _ly + 1;
  }
  return local_34;
}

Assistant:

int get_rect_ind(struct nhrect *r)
{
	struct nhrect *rectp;
	int lx, ly, hx, hy;
	int i;

	lx = r->lx; ly = r->ly;
	hx = r->hx; hy = r->hy;
	for (i=0,rectp = &rect[0];i<rect_cnt;i++,rectp++)
	    if ( lx == rectp->lx && ly == rectp->ly &&
		 hx == rectp->hx && hy == rectp->hy)
		return i;
	return -1;
}